

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visualizer.cpp
# Opt level: O0

bool __thiscall iDynTree::Visualizer::setColorPalette(Visualizer *this,string *name)

{
  iDynTree::reportError
            ("Visualizer","setColorPalette",
             "Impossible to use iDynTree::Visualizer, as iDynTree has been compiled without Irrlicht."
            );
  return false;
}

Assistant:

bool Visualizer::setColorPalette(const std::string &name)
{
#ifdef IDYNTREE_USES_IRRLICHT

    if( !pimpl->m_isInitialized )
    {
        reportError("Visualizer",
                    "setColorPalette",
                    "Impossible to set the color palette. Please initialize the visualizer");
        return false;
    }

    const auto colors = pimpl->m_palette.find(name);

    if(colors == pimpl->m_palette.end())
    {
        std::string paletteName;
        for (const auto& tmp: pimpl->m_palette)
            paletteName += " " + tmp.first;

        const std::string error = "The palette named " + name
                                + " does not exist. The following palette are available"
                                + paletteName + ".";

        reportError("Visualizer","setColorPalette", error.c_str());
        return false;
    }

    this->environment().setBackgroundColor(irrlicht2idyntree(colors->second.background));
    this->environment().setFloorGridColor(irrlicht2idyntree(colors->second.gridColor));

    this->vectors().setVectorsColor(irrlicht2idyntree(colors->second.vector));
    this->vectors().setVectorsDefaultColor(irrlicht2idyntree(colors->second.vector));

    // delete the frame in the origin and create a new one
    pimpl->m_environment.m_rootFrameNode->remove();
    pimpl->m_environment.m_rootFrameNode = addFrameAxes(pimpl->m_irrSmgr,
                                                        pimpl->m_environment.m_envNode,
                                                        pimpl->rootFrameArrowsDimension,
                                                        colors->second.xAxis,
                                                        colors->second.yAxis,
                                                        colors->second.zAxis);
    return true;

#else
    reportError("Visualizer","setColorPalette",
                "Impossible to use iDynTree::Visualizer, as iDynTree has been compiled without Irrlicht.");
    return false;
#endif
}